

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O2

double TasGrid::RuleLocal::diffPWPower<(TasGrid::RuleLocal::erule)1>
                 (int max_order,int point,double x)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_type __n;
  int j;
  long lVar4;
  double dVar5;
  allocator_type local_a1;
  double local_a0;
  double local_98;
  double local_90;
  int point_local;
  double local_80;
  int most_turns;
  vector<double,_std::allocator<double>_> left_prods;
  anon_class_24_3_cb42508a rollback_and_get_prev_node;
  double phantom_distance;
  anon_class_24_3_cb42508a update_and_get_next_node;
  
  point_local = point;
  if (point < 9) {
    dVar5 = diffPWCubic<(TasGrid::RuleLocal::erule)1>(point,x);
    return dVar5;
  }
  local_80 = x;
  iVar1 = getLevel<(TasGrid::RuleLocal::erule)1>(point);
  iVar1 = iVar1 + -2;
  iVar2 = max_order + -2;
  if (iVar1 <= max_order + -2) {
    iVar2 = iVar1;
  }
  if (max_order < 1) {
    iVar2 = iVar1;
  }
  rollback_and_get_prev_node.most_turns = &most_turns;
  most_turns = 1;
  rollback_and_get_prev_node.phantom_distance = &phantom_distance;
  phantom_distance = 1.0;
  rollback_and_get_prev_node.point = &point_local;
  __n = (size_type)iVar2;
  update_and_get_next_node.most_turns = rollback_and_get_prev_node.most_turns;
  update_and_get_next_node.phantom_distance = rollback_and_get_prev_node.phantom_distance;
  update_and_get_next_node.point = rollback_and_get_prev_node.point;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&left_prods,__n,&local_a1);
  *left_prods.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 1.0;
  dVar5 = diffPWPower<(TasGrid::RuleLocal::erule)1>::anon_class_24_3_cb42508a::operator()
                    (&update_and_get_next_node);
  local_a0 = -1.0 / dVar5;
  lVar4 = 1;
  while( true ) {
    if ((long)__n <= lVar4) break;
    left_prods.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4] =
         (local_80 - dVar5) *
         left_prods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar4 + -1];
    dVar5 = diffPWPower<(TasGrid::RuleLocal::erule)1>::anon_class_24_3_cb42508a::operator()
                      (&update_and_get_next_node);
    local_a0 = local_a0 * (-1.0 / dVar5);
    lVar4 = lVar4 + 1;
  }
  local_98 = left_prods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[__n - 1];
  local_90 = 1.0;
  for (uVar3 = iVar2 - 2; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    local_90 = local_90 * (local_80 - dVar5);
    local_98 = local_98 +
               left_prods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3] * local_90;
    dVar5 = diffPWPower<(TasGrid::RuleLocal::erule)1>::anon_class_24_3_cb42508a::operator()
                      (&rollback_and_get_prev_node);
  }
  local_a0 = local_a0 *
             (local_90 * (local_80 - dVar5) * -2.0 * local_80 +
             (local_80 + 1.0) * (1.0 - local_80) * local_98);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&left_prods);
  return local_a0;
}

Assistant:

double diffPWPower(int max_order, int point, double x) {
        // use the cubic implementation until we have enough points
        if (effrule == erule::localp     and point <= 8) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::semilocalp and point <= 4) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::localpb    and point <= 4) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::localp0    and point <= 2) return diffPWCubic<effrule>(point, x);
        int level = getLevel<effrule>(point);
        int max_ancestors = [&]()->int {
            switch(effrule) {
                case erule::pwc:        return 0;
                case erule::localp:     return level - 2;
                case erule::semilocalp:
                case erule::localpb:    return level - 1;
                default:                return level;
            };
        }();

        if (max_order > 0) max_ancestors = std::min(max_ancestors, max_order - 2);

        // This lambda captures most_turns and phantom_distance by reference, uses those as internal state variables, and on each
        // call it returns the next normalized ancestor node.
        int most_turns = 1;
        double phantom_distance = 1.0;
        auto update_and_get_next_node = [&]() {
            most_turns *= 2;
            phantom_distance = 2.0 * phantom_distance + 1.0;
            int turns = (effrule == erule::localp0) ? ((point+1) % most_turns) : ((point-1) % most_turns);
            return (turns < most_turns / 2) ?
                    (phantom_distance - 2.0 * ((double) turns)) :
                    (-phantom_distance + 2.0 * ((double) (most_turns - 1 - turns)));
        };

        // This lambda is the inverse transform of update_and_get_next_node() above, and returns the previous descendant node.
        auto rollback_and_get_prev_node = [&]() {
            most_turns /= 2;
            phantom_distance = 0.5 * (phantom_distance - 1.0);
            int turns = (effrule == erule::localp0) ? ((point+1) % most_turns) : ((point-1) % most_turns);
            return (turns < most_turns / 2) ?
                    (phantom_distance - 2.0 * ((double) turns)) :
                    (-phantom_distance + 2.0 * ((double) (most_turns - 1 - turns)));
        };

        // Does not include the additional factor (1-x) * (1+x) and the Lagrange coefficient.
        std::vector<double> left_prods(max_ancestors);
        left_prods[0] = 1.0;
        double node = update_and_get_next_node();
        double coeff = 1.0 / (-node);
        for(int j=1; j<max_ancestors; j++) {
            left_prods[j] = left_prods[j-1] * (x - node);
            node = update_and_get_next_node();
            coeff *= 1.0 / (-node);
        }
        double right_prod = 1.0;
        double derivative = left_prods[max_ancestors-1];
        for (int j=max_ancestors-2; j>=0; j--) {
            right_prod *= x - node;
            derivative += right_prod * left_prods[j];
            node = rollback_and_get_prev_node();
        }

        // Adjust for the additional factor (1-x) * (1+x) and the Lagrange coefficient.
        derivative = derivative * (1.0 - x) * (1.0 + x) + right_prod * (x - node) * (-2.0) * x;
        derivative *= coeff;

        return derivative;
    }